

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_system_memory.c
# Opt level: O3

SUNErrCode
SUNMemoryHelper_GetAllocStats_Sys
          (SUNMemoryHelper helper,SUNMemoryType mem_type,unsigned_long *num_allocations,
          unsigned_long *num_deallocations,size_t *bytes_allocated,size_t *bytes_high_watermark)

{
  unsigned_long *puVar1;
  
  puVar1 = (unsigned_long *)helper->content;
  *num_allocations = *puVar1;
  *num_deallocations = puVar1[1];
  *bytes_allocated = puVar1[2];
  *bytes_high_watermark = puVar1[3];
  return 0;
}

Assistant:

SUNErrCode SUNMemoryHelper_GetAllocStats_Sys(
  SUNMemoryHelper helper, SUNDIALS_MAYBE_UNUSED SUNMemoryType mem_type,
  unsigned long* num_allocations, unsigned long* num_deallocations,
  size_t* bytes_allocated, size_t* bytes_high_watermark)
{
  SUNFunctionBegin(helper->sunctx);
  SUNAssert(mem_type == SUNMEMTYPE_HOST, SUN_ERR_ARG_INCOMPATIBLE);
  *num_allocations      = SUNHELPER_CONTENT(helper)->num_allocations;
  *num_deallocations    = SUNHELPER_CONTENT(helper)->num_deallocations;
  *bytes_allocated      = SUNHELPER_CONTENT(helper)->bytes_allocated;
  *bytes_high_watermark = SUNHELPER_CONTENT(helper)->bytes_high_watermark;
  return SUN_SUCCESS;
}